

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.cpp
# Opt level: O1

void decFinalize(decNumber *dn,decContext *set,int32_t *residue,uint32_t *status)

{
  int iVar1;
  int32_t iVar2;
  int iVar3;
  int shift;
  decNumber local_34;
  
  iVar1 = set->emin;
  if ((iVar1 - dn->digits) + 1 < dn->exponent) {
LAB_0023ed98:
    if (*residue != 0) {
      decApplyRound(dn,set,*residue,status);
    }
    iVar1 = dn->exponent;
    iVar3 = (set->emax - set->digits) + 1;
    shift = iVar1 - iVar3;
    if (shift != 0 && iVar3 <= iVar1) {
      iVar3 = dn->digits;
      if ((set->emax - iVar3) + 1 < iVar1) {
        decSetOverflow(dn,set,status);
      }
      else if (set->clamp != '\0') {
        if (((iVar3 != 1) || (dn->lsu[0] != '\0')) || ((dn->bits & 0x70) != 0)) {
          iVar2 = decShiftToMost(dn->lsu,iVar3,shift);
          dn->digits = iVar2;
        }
        dn->exponent = dn->exponent - shift;
        *(byte *)((long)status + 1) = *(byte *)((long)status + 1) | 4;
      }
    }
  }
  else {
    if (iVar1 - dn->digits < dn->exponent) {
      local_34.bits = '\0';
      local_34.lsu[0] = '\x01';
      local_34.digits = 1;
      local_34.exponent = iVar1;
      iVar2 = decCompare(dn,&local_34,'\x01');
      if (iVar2 != 0 || -1 < *residue) goto LAB_0023ed98;
      decApplyRound(dn,set,*residue,status);
    }
    decSetSubnormal(dn,set,residue,status);
  }
  return;
}

Assistant:

static void decFinalize(decNumber *dn, decContext *set, Int *residue,
                        uInt *status) {
  Int shift;                            /* shift needed if clamping  */
  Int tinyexp=set->emin-dn->digits+1;   /* precalculate subnormal boundary  */

  /* Must be careful, here, when checking the exponent as the  */
  /* adjusted exponent could overflow 31 bits [because it may already  */
  /* be up to twice the expected].  */

  /* First test for subnormal.  This must be done before any final  */
  /* round as the result could be rounded to Nmin or 0.  */
  if (dn->exponent<=tinyexp) {          /* prefilter  */
    Int comp;
    decNumber nmin;
    /* A very nasty case here is dn == Nmin and residue<0  */
    if (dn->exponent<tinyexp) {
      /* Go handle subnormals; this will apply round if needed.  */
      decSetSubnormal(dn, set, residue, status);
      return;
      }
    /* Equals case: only subnormal if dn=Nmin and negative residue  */
    uprv_decNumberZero(&nmin);
    nmin.lsu[0]=1;
    nmin.exponent=set->emin;
    comp=decCompare(dn, &nmin, 1);                /* (signless compare)  */
    if (comp==BADINT) {                           /* oops  */
      *status|=DEC_Insufficient_storage;          /* abandon...  */
      return;
      }
    if (*residue<0 && comp==0) {                  /* neg residue and dn==Nmin  */
      decApplyRound(dn, set, *residue, status);   /* might force down  */
      decSetSubnormal(dn, set, residue, status);
      return;
      }
    }

  /* now apply any pending round (this could raise overflow).  */
  if (*residue!=0) decApplyRound(dn, set, *residue, status);

  /* Check for overflow [redundant in the 'rare' case] or clamp  */
  if (dn->exponent<=set->emax-set->digits+1) return;   /* neither needed  */


  /* here when might have an overflow or clamp to do  */
  if (dn->exponent>set->emax-dn->digits+1) {           /* too big  */
    decSetOverflow(dn, set, status);
    return;
    }
  /* here when the result is normal but in clamp range  */
  if (!set->clamp) return;

  /* here when need to apply the IEEE exponent clamp (fold-down)  */
  shift=dn->exponent-(set->emax-set->digits+1);

  /* shift coefficient (if non-zero)  */
  if (!ISZERO(dn)) {
    dn->digits=decShiftToMost(dn->lsu, dn->digits, shift);
    }
  dn->exponent-=shift;   /* adjust the exponent to match  */
  *status|=DEC_Clamped;  /* and record the dirty deed  */
  return;
  }